

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O0

Ivy_Obj_t * Ivy_ManDsdConstruct_rec(Ivy_Man_t *p,Vec_Int_t *vFront,int iNode,Vec_Int_t *vTree)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Type_t Type;
  int Var0;
  int Var1;
  int VarC;
  Ivy_Dec_t Node;
  int i;
  int Var;
  Ivy_Obj_t *pNodes [16];
  Ivy_Obj_t *pChild;
  Ivy_Obj_t *pResult;
  Vec_Int_t *vTree_local;
  int iNode_local;
  Vec_Int_t *vFront_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Vec_IntEntry(vTree,iNode);
  Var1 = (int)Ivy_IntToDec(iVar1);
  if ((Var1 & 0xfU) == 1) {
    pIVar5 = Ivy_ManConst1(p);
    p_local = (Ivy_Man_t *)Ivy_NotCond(pIVar5,(uint)Var1 >> 4 & 1);
  }
  else if ((Var1 & 0xfU) == 0) {
    iVar1 = Vec_IntEntry(vFront,iNode);
    pIVar5 = Ivy_ManObj(p,iVar1);
    p_local = (Ivy_Man_t *)Ivy_NotCond(pIVar5,(uint)Var1 >> 4 & 1);
  }
  else if ((Var1 & 0xfU) == 2) {
    pIVar5 = Ivy_ManDsdConstruct_rec(p,vFront,(int)((uint)Var1 >> 8 & 0xf) >> 1,vTree);
    p_local = (Ivy_Man_t *)Ivy_NotCond(pIVar5,(uint)Var1 >> 4 & 1);
  }
  else if (((Var1 & 0xfU) == 3) || ((Var1 & 0xfU) == 4)) {
    for (VarC = 0; VarC < (int)((uint)Var1 >> 5 & 7); VarC = VarC + 1) {
      Node = (Ivy_Dec_t)Ivy_DecGetVar((Ivy_Dec_t *)&Var1,VarC);
      if (((Var1 & 0xfU) != 3) && (((uint)Node & 1) != 0)) {
        __assert_fail("Node.Type == IVY_DEC_AND || (Var & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                      ,0x262,
                      "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                     );
      }
      pIVar5 = Ivy_ManDsdConstruct_rec(p,vFront,(int)Node >> 1,vTree);
      pIVar5 = Ivy_NotCond(pIVar5,(uint)Node & 1);
      *(Ivy_Obj_t **)(&i + (long)VarC * 2) = pIVar5;
    }
    Type = IVY_EXOR;
    if ((Var1 & 0xfU) == 3) {
      Type = IVY_AND;
    }
    pIVar5 = Ivy_Multi(p,(Ivy_Obj_t **)&i,(uint)Var1 >> 5 & 7,Type);
    p_local = (Ivy_Man_t *)Ivy_NotCond(pIVar5,(uint)Var1 >> 4 & 1);
  }
  else {
    if (((uint)Var1 >> 4 & 1) != 0) {
      __assert_fail("Node.fCompl == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                    ,0x26d,
                    "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                   );
    }
    if (((Var1 & 0xfU) != 5) && ((Var1 & 0xfU) != 6)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                    ,0x280,
                    "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                   );
    }
    uVar2 = Ivy_DecGetVar((Ivy_Dec_t *)&Var1,0);
    uVar3 = Ivy_DecGetVar((Ivy_Dec_t *)&Var1,1);
    uVar4 = Ivy_DecGetVar((Ivy_Dec_t *)&Var1,2);
    _i = Ivy_ManDsdConstruct_rec(p,vFront,(int)uVar2 >> 1,vTree);
    pNodes[0] = Ivy_ManDsdConstruct_rec(p,vFront,(int)uVar3 >> 1,vTree);
    pNodes[1] = Ivy_ManDsdConstruct_rec(p,vFront,(int)uVar4 >> 1,vTree);
    if (((Var1 & 0xfU) != 6) && ((uVar2 & 1) != 0)) {
      __assert_fail("Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                    ,0x277,
                    "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                   );
    }
    _i = Ivy_NotCond(_i,uVar2 & 1);
    pNodes[0] = Ivy_NotCond(pNodes[0],uVar3 & 1);
    pNodes[1] = Ivy_NotCond(pNodes[1],uVar4 & 1);
    if ((Var1 & 0xfU) == 5) {
      p_local = (Ivy_Man_t *)Ivy_Mux(p,_i,pNodes[0],pNodes[1]);
    }
    else {
      p_local = (Ivy_Man_t *)Ivy_Maj(p,_i,pNodes[0],pNodes[1]);
    }
  }
  return (Ivy_Obj_t *)p_local;
}

Assistant:

Ivy_Obj_t * Ivy_ManDsdConstruct_rec( Ivy_Man_t * p, Vec_Int_t * vFront, int iNode, Vec_Int_t * vTree )
{
    Ivy_Obj_t * pResult, * pChild, * pNodes[16];
    int Var, i;
    // get the node
    Ivy_Dec_t Node = Ivy_IntToDec( Vec_IntEntry(vTree, iNode) );
    // compute the node function
    if ( Node.Type == IVY_DEC_CONST1 )
        return Ivy_NotCond( Ivy_ManConst1(p), Node.fCompl );
    if ( Node.Type == IVY_DEC_PI )
    {
        pResult = Ivy_ManObj( p, Vec_IntEntry(vFront, iNode) );
        return Ivy_NotCond( pResult, Node.fCompl );
    }
    if ( Node.Type == IVY_DEC_BUF )
    {
        pResult = Ivy_ManDsdConstruct_rec( p, vFront, Node.Fan0 >> 1, vTree );
        return Ivy_NotCond( pResult, Node.fCompl );
    }
    if ( Node.Type == IVY_DEC_AND || Node.Type == IVY_DEC_EXOR )
    {
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            assert( Node.Type == IVY_DEC_AND || (Var & 1) == 0 );
            pChild = Ivy_ManDsdConstruct_rec( p, vFront, Var >> 1, vTree );
            pChild = Ivy_NotCond( pChild, (Var & 1) );
            pNodes[i] = pChild;
        }

//        Ivy_MultiEval( pNodes, Node.nFans, Node.Type == IVY_DEC_AND ? IVY_AND : IVY_EXOR );

        pResult = Ivy_Multi( p, pNodes, Node.nFans, Node.Type == IVY_DEC_AND ? IVY_AND : IVY_EXOR );
        return Ivy_NotCond( pResult, Node.fCompl );
    }
    assert( Node.fCompl == 0 );
    if ( Node.Type == IVY_DEC_MUX || Node.Type == IVY_DEC_MAJ )
    {
        int VarC, Var1, Var0;
        VarC = Ivy_DecGetVar( &Node, 0 );
        Var1 = Ivy_DecGetVar( &Node, 1 );
        Var0 = Ivy_DecGetVar( &Node, 2 );
        pNodes[0] = Ivy_ManDsdConstruct_rec( p, vFront, VarC >> 1, vTree );
        pNodes[1] = Ivy_ManDsdConstruct_rec( p, vFront, Var1 >> 1, vTree );
        pNodes[2] = Ivy_ManDsdConstruct_rec( p, vFront, Var0 >> 1, vTree );
        assert( Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0 );
        pNodes[0] = Ivy_NotCond( pNodes[0], (VarC & 1) );
        pNodes[1] = Ivy_NotCond( pNodes[1], (Var1 & 1) );
        pNodes[2] = Ivy_NotCond( pNodes[2], (Var0 & 1) );
        if ( Node.Type == IVY_DEC_MUX )
            return Ivy_Mux( p, pNodes[0], pNodes[1], pNodes[2] );
        else
            return Ivy_Maj( p, pNodes[0], pNodes[1], pNodes[2] );
    }
    assert( 0 );
    return 0;
}